

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O1

void V_DrawFrame(int left,int top,int width,int height)

{
  DFrameBuffer *pDVar1;
  uint uVar2;
  FTextureID FVar3;
  uint uVar4;
  FTexture *pFVar5;
  uint uVar6;
  FTexture *pFVar7;
  double x;
  double y;
  
  uVar2 = (uint)gameinfo.Border.offset;
  uVar6 = width + left;
  uVar4 = height + top;
  FVar3 = FTextureManager::GetTexture(&TexMan,gameinfo.Border.t.Chars,8,0);
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
            (screen,(ulong)(uint)left,
             (ulong)(top - (uint)(TexMan.Textures.Array[(uint)FVar3.texnum].Texture)->Height),
             (ulong)uVar6,(ulong)(uint)top,TexMan.Textures.Array[(uint)FVar3.texnum].Texture,1);
  FVar3 = FTextureManager::GetTexture(&TexMan,gameinfo.Border.b.Chars,8,0);
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
            (screen,(ulong)(uint)left,(ulong)uVar4,(ulong)uVar6,
             (ulong)((TexMan.Textures.Array[(uint)FVar3.texnum].Texture)->Height + uVar4),
             TexMan.Textures.Array[(uint)FVar3.texnum].Texture,1);
  FVar3 = FTextureManager::GetTexture(&TexMan,gameinfo.Border.l.Chars,8,0);
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
            (screen,(ulong)(left - (uint)(TexMan.Textures.Array[(uint)FVar3.texnum].Texture)->Width)
             ,(ulong)(uint)top,(ulong)(uint)left,(ulong)uVar4,
             TexMan.Textures.Array[(uint)FVar3.texnum].Texture,1);
  FVar3 = FTextureManager::GetTexture(&TexMan,gameinfo.Border.r.Chars,8,0);
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
            (screen,(ulong)uVar6,(ulong)(uint)top,
             (ulong)((TexMan.Textures.Array[(uint)FVar3.texnum].Texture)->Width + uVar6),
             (ulong)uVar4,TexMan.Textures.Array[(uint)FVar3.texnum].Texture,1);
  pDVar1 = screen;
  FVar3 = FTextureManager::GetTexture(&TexMan,gameinfo.Border.tl.Chars,8,0);
  if (FVar3.texnum < 0) {
    pFVar7 = (FTexture *)0x0;
  }
  else {
    pFVar7 = TexMan.Textures.Array[(uint)FVar3.texnum].Texture;
  }
  x = (double)(int)(left - uVar2);
  y = (double)(int)(top - uVar2);
  pFVar5 = (FTexture *)0x0;
  DCanvas::DrawTexture((DCanvas *)pDVar1,pFVar7,x,y,0);
  pDVar1 = screen;
  FVar3 = FTextureManager::GetTexture(&TexMan,gameinfo.Border.tr.Chars,8,0);
  if (-1 < FVar3.texnum) {
    pFVar5 = TexMan.Textures.Array[(uint)FVar3.texnum].Texture;
  }
  pFVar7 = (FTexture *)0x0;
  DCanvas::DrawTexture((DCanvas *)pDVar1,pFVar5,(double)(int)uVar6,y,0);
  pDVar1 = screen;
  FVar3 = FTextureManager::GetTexture(&TexMan,gameinfo.Border.bl.Chars,8,0);
  if (-1 < FVar3.texnum) {
    pFVar7 = TexMan.Textures.Array[(uint)FVar3.texnum].Texture;
  }
  pFVar5 = (FTexture *)0x0;
  DCanvas::DrawTexture((DCanvas *)pDVar1,pFVar7,x,(double)(int)uVar4,0);
  pDVar1 = screen;
  FVar3 = FTextureManager::GetTexture(&TexMan,gameinfo.Border.br.Chars,8,0);
  if (-1 < FVar3.texnum) {
    pFVar5 = TexMan.Textures.Array[(uint)FVar3.texnum].Texture;
  }
  DCanvas::DrawTexture((DCanvas *)pDVar1,pFVar5,(double)(int)uVar6,(double)(int)uVar4,0);
  return;
}

Assistant:

void V_DrawFrame (int left, int top, int width, int height)
{
	FTexture *p;
	const gameborder_t *border = &gameinfo.Border;
	// Sanity check for incomplete gameinfo
	if (border == NULL)
		return;
	int offset = border->offset;
	int right = left + width;
	int bottom = top + height;

	// Draw top and bottom sides.
	p = TexMan[border->t];
	screen->FlatFill(left, top - p->GetHeight(), right, top, p, true);
	p = TexMan[border->b];
	screen->FlatFill(left, bottom, right, bottom + p->GetHeight(), p, true);

	// Draw left and right sides.
	p = TexMan[border->l];
	screen->FlatFill(left - p->GetWidth(), top, left, bottom, p, true);
	p = TexMan[border->r];
	screen->FlatFill(right, top, right + p->GetWidth(), bottom, p, true);

	// Draw beveled corners.
	screen->DrawTexture (TexMan[border->tl], left-offset, top-offset, TAG_DONE);
	screen->DrawTexture (TexMan[border->tr], left+width, top-offset, TAG_DONE);
	screen->DrawTexture (TexMan[border->bl], left-offset, top+height, TAG_DONE);
	screen->DrawTexture (TexMan[border->br], left+width, top+height, TAG_DONE);
}